

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

void __thiscall Cache::setByte(Cache *this,uint32_t addr,uint8_t val,uint32_t *cycles)

{
  uint32_t uVar1;
  uint32_t uVar2;
  reference pvVar3;
  reference pvVar4;
  Block *in_RCX;
  undefined1 in_DL;
  undefined4 in_ESI;
  long in_RDI;
  uint32_t offset_1;
  uint32_t offset;
  int blockId;
  uint32_t *in_stack_000000b0;
  uint32_t in_stack_000000bc;
  Cache *in_stack_000000c0;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t uVar5;
  uint32_t in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_fffffffffffffff0;
  undefined4 uVar6;
  value_type vVar7;
  
  uVar6 = CONCAT13(in_DL,in_stack_fffffffffffffff0);
  *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
  *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 1;
  uVar1 = getBlockId((Cache *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc4);
  if (uVar1 == 0xffffffff) {
    *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
    *(ulong *)(in_RDI + 0x10) = (ulong)*(uint *)(in_RDI + 0x44) + *(long *)(in_RDI + 0x10);
    if ((*(byte *)(in_RDI + 0x1d) & 1) == 0) {
      if (*(long *)(in_RDI + 0x28) == 0) {
        MemoryManager::setByteNoCache
                  ((MemoryManager *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   (uint32_t)((ulong)in_RDI >> 0x20),(uint8_t)((ulong)in_RDI >> 0x18));
      }
      else {
        setByte((Cache *)CONCAT44(in_ESI,uVar6),(uint32_t)((ulong)in_RCX >> 0x20),
                (uint8_t)((ulong)in_RCX >> 0x18),
                (uint32_t *)CONCAT44(0xffffffff,in_stack_ffffffffffffffe0));
      }
    }
    else {
      loadBlockFromLowerLevel(in_stack_000000c0,in_stack_000000bc,in_stack_000000b0);
      vVar7 = (value_type)((uint)uVar6 >> 0x18);
      uVar1 = getBlockId((Cache *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc4);
      if (uVar1 == 0xffffffff) {
        fprintf(_stderr,"Error: data not in top level cache!\n");
        exit(-1);
      }
      uVar2 = getOffset((Cache *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
      pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                         ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x48),
                          (long)(int)uVar1);
      pvVar3->modified = true;
      uVar5 = *(uint32_t *)(in_RDI + 0x18);
      pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                         ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x48),
                          (long)(int)uVar1);
      pvVar3->lastReference = uVar5;
      pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                         ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x48),
                          (long)(int)uVar1);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&pvVar3->data,(ulong)uVar2);
      *pvVar4 = vVar7;
    }
  }
  else {
    uVar2 = getOffset((Cache *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
    *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
    *(ulong *)(in_RDI + 0x10) = (ulong)*(uint *)(in_RDI + 0x40) + *(long *)(in_RDI + 0x10);
    pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x48),
                        (long)(int)uVar1);
    pvVar3->modified = true;
    uVar5 = *(uint32_t *)(in_RDI + 0x18);
    pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x48),
                        (long)(int)uVar1);
    pvVar3->lastReference = uVar5;
    vVar7 = (value_type)((uint)uVar6 >> 0x18);
    pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x48),
                        (long)(int)uVar1);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pvVar3->data,(ulong)uVar2);
    *pvVar4 = vVar7;
    if ((*(byte *)(in_RDI + 0x1c) & 1) == 0) {
      std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x48),
                 (long)(int)uVar1);
      writeBlockToLowerLevel((Cache *)CONCAT44(in_ESI,uVar6),in_RCX);
      *(ulong *)(in_RDI + 0x10) = (ulong)*(uint *)(in_RDI + 0x44) + *(long *)(in_RDI + 0x10);
    }
    if (in_RCX != (Block *)0x0) {
      uVar6 = *(undefined4 *)(in_RDI + 0x40);
      in_RCX->valid = (bool)(char)uVar6;
      in_RCX->modified = (bool)(char)((uint)uVar6 >> 8);
      *(short *)&in_RCX->field_0x2 = (short)((uint)uVar6 >> 0x10);
    }
  }
  return;
}

Assistant:

void Cache::setByte(uint32_t addr, uint8_t val, uint32_t *cycles) {
  this->referenceCounter++;
  this->statistics.numWrite++;

  // If in cache, write to it directly
  int blockId;
  if ((blockId = this->getBlockId(addr)) != -1) {
    uint32_t offset = this->getOffset(addr);
    this->statistics.numHit++;
    this->statistics.totalCycles += this->policy.hitLatency;
    this->blocks[blockId].modified = true;
    this->blocks[blockId].lastReference = this->referenceCounter;
    this->blocks[blockId].data[offset] = val;
    if (!this->writeBack) {
      this->writeBlockToLowerLevel(this->blocks[blockId]);
      this->statistics.totalCycles += this->policy.missLatency;
    }
    if (cycles) *cycles = this->policy.hitLatency;
    return;
  }

  // Else, load the data from cache
  // TODO: implement bypassing
  this->statistics.numMiss++;
  this->statistics.totalCycles += this->policy.missLatency;

  if (this->writeAllocate) {
    this->loadBlockFromLowerLevel(addr, cycles);

    if ((blockId = this->getBlockId(addr)) != -1) {
      uint32_t offset = this->getOffset(addr);
      this->blocks[blockId].modified = true;
      this->blocks[blockId].lastReference = this->referenceCounter;
      this->blocks[blockId].data[offset] = val;
      return;
    } else {
      fprintf(stderr, "Error: data not in top level cache!\n");
      exit(-1);
    }
  } else {
    if (this->lowerCache == nullptr) {
      this->memory->setByteNoCache(addr, val);
    } else {
      this->lowerCache->setByte(addr, val);
    }
  }
}